

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuInterval.cpp
# Opt level: O3

Interval * tcu::operator-(Interval *__return_storage_ptr__,Interval *x,Interval *y)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  deRoundingMode dVar5;
  byte bVar6;
  byte bVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double local_88;
  
  __return_storage_ptr__->m_hasNaN = false;
  __return_storage_ptr__->m_lo = INFINITY;
  __return_storage_ptr__->m_hi = -INFINITY;
  dVar11 = x->m_lo;
  local_88 = x->m_hi;
  if (dVar11 <= local_88) {
    dVar10 = y->m_lo;
    dVar9 = y->m_hi;
    if (dVar10 <= dVar9) {
      dVar5 = deGetRoundingMode();
      deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
      dVar10 = dVar11 - dVar10;
      dVar9 = dVar10;
      if (NAN(dVar10)) {
        dVar9 = INFINITY;
      }
      deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
      deSetRoundingMode(dVar5);
      dVar13 = y->m_hi;
      dVar5 = deGetRoundingMode();
      deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
      dVar11 = dVar11 - dVar13;
      dVar13 = dVar11;
      if (NAN(dVar11)) {
        dVar13 = INFINITY;
      }
      deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
      deSetRoundingMode(dVar5);
      dVar12 = (double)(-(ulong)NAN(dVar10) & 0xfff0000000000000 |
                       ~-(ulong)NAN(dVar10) & (ulong)dVar10);
      dVar14 = (double)(-(ulong)NAN(dVar11) & 0xfff0000000000000 |
                       ~-(ulong)NAN(dVar11) & (ulong)dVar11);
      bVar7 = -(NAN(dVar10) || NAN(dVar11));
      dVar13 = (double)(~-(ulong)(dVar9 <= dVar13) & (ulong)dVar13 |
                       (ulong)dVar9 & -(ulong)(dVar9 <= dVar13));
      uVar8 = -(ulong)(dVar14 <= dVar12);
      dVar11 = (double)(~uVar8 & (ulong)dVar14 | uVar8 & (ulong)dVar12);
      local_88 = x->m_hi;
      dVar10 = y->m_lo;
      dVar9 = y->m_hi;
    }
    else {
      bVar7 = 0;
      dVar13 = INFINITY;
      dVar11 = -INFINITY;
    }
    dVar12 = -INFINITY;
    dVar14 = INFINITY;
    bVar1 = y->m_hasNaN;
    if (dVar10 <= dVar9) {
      dVar5 = deGetRoundingMode();
      deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
      dVar10 = local_88 - dVar10;
      dVar9 = dVar10;
      if (NAN(dVar10)) {
        dVar9 = INFINITY;
      }
      deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
      deSetRoundingMode(dVar5);
      dVar12 = y->m_hi;
      dVar5 = deGetRoundingMode();
      deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
      local_88 = local_88 - dVar12;
      dVar12 = local_88;
      if (NAN(local_88)) {
        dVar12 = INFINITY;
      }
      deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
      deSetRoundingMode(dVar5);
      dVar2 = (double)(-(ulong)NAN(dVar10) & 0xfff0000000000000 |
                      ~-(ulong)NAN(dVar10) & (ulong)dVar10);
      dVar3 = (double)(-(ulong)NAN(local_88) & 0xfff0000000000000 |
                      ~-(ulong)NAN(local_88) & (ulong)local_88);
      bVar4 = (bool)((-NAN(dVar10) | -NAN(local_88)) & 1);
      dVar14 = (double)(~-(ulong)(dVar9 <= dVar12) & (ulong)dVar12 |
                       (ulong)dVar9 & -(ulong)(dVar9 <= dVar12));
      uVar8 = -(ulong)(dVar3 <= dVar2);
      dVar12 = (double)(~uVar8 & (ulong)dVar3 | uVar8 & (ulong)dVar2);
      bVar6 = y->m_hasNaN;
    }
    else {
      bVar4 = false;
      bVar6 = bVar1;
    }
    if ((bVar6 & 1) != 0) {
      bVar4 = true;
    }
    if (((bVar1 | bVar7) & 1) != 0) {
      bVar4 = true;
    }
    dVar10 = (double)(~-(ulong)(dVar13 <= dVar14) & (ulong)dVar14 |
                     (ulong)dVar13 & -(ulong)(dVar13 <= dVar14));
    dVar11 = (double)(~-(ulong)(dVar12 <= dVar11) & (ulong)dVar12 |
                     (ulong)dVar11 & -(ulong)(dVar12 <= dVar11));
  }
  else {
    dVar10 = INFINITY;
    dVar11 = -INFINITY;
    bVar4 = false;
  }
  __return_storage_ptr__->m_hasNaN = bVar4;
  __return_storage_ptr__->m_lo = dVar10;
  __return_storage_ptr__->m_hi = dVar11;
  if (x->m_hasNaN == true) {
    __return_storage_ptr__->m_hasNaN = true;
    __return_storage_ptr__->m_lo = dVar10;
    __return_storage_ptr__->m_hi = dVar11;
  }
  return __return_storage_ptr__;
}

Assistant:

Interval operator- (const Interval& x, const Interval& y)
{
	Interval ret;

	TCU_INTERVAL_APPLY_MONOTONE2(ret, xp, x, yp, y, val,
								 TCU_SET_INTERVAL(val, point, point = xp - yp));
	return ret;
}